

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableTest_InsertValueToMap_Test::TestBody(HashtableTest_InsertValueToMap_Test *this)

{
  undefined8 *puVar1;
  size_type sVar2;
  size_type sVar3;
  undefined8 uVar4;
  KeyInfo rhs;
  value_type *pvVar5;
  value_type *pvVar6;
  int *piVar7;
  pointer ppVar8;
  char *pcVar9;
  string *set;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  shm;
  AssertHelper local_108;
  pair<const_int,_int> local_100;
  undefined8 *local_f8;
  string local_f0;
  AssertHelper local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  KeyInfo local_a8;
  iterator iStack_a0;
  iterator local_98;
  iterator local_90;
  pointer local_80;
  sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  local_78;
  
  set = &local_f0;
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::sparse_hashtable(&local_78,0,(hash<int> *)&local_100,(equal_to<int> *)&local_108,
                     (SelectKey *)local_c8,(SetKey *)set,
                     (libc_allocator_with_realloc<std::pair<const_int,_int>_> *)&local_d0);
  local_c8._0_4_ = 1;
  pvVar5 = google::
           sparse_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
           ::
           find_or_insert<google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::DefaultValue>
                     ((sparse_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                       *)&local_78,(key_type *)local_c8);
  pvVar5->second = 2;
  local_f0._M_dataplus._M_p = &DAT_300000001;
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::resize_delta(&local_78,1);
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_bool>
                     *)local_c8,&local_78,(const_reference)&local_f0);
  rhs = local_a8;
  local_f0._M_dataplus._M_p =
       (pointer)(CONCAT71(local_f0._M_dataplus._M_p._1_7_,local_80._0_1_) ^ 1);
  local_f0._M_string_length = 0;
  if (local_80._0_1_ != false) {
    testing::Message::Message((Message *)&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)&local_f0,(AssertionResult *)"shm_it.second","true",
               "false",(char *)set);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x3cb,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)local_c8._0_8_ !=
        (sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)local_b8) {
      operator_delete((void *)local_c8._0_8_);
    }
    if (local_100 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_100 + 8))();
    }
  }
  sVar2 = local_f0._M_string_length;
  if ((undefined8 *)local_f0._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_f0._M_string_length !=
        (undefined8 *)(local_f0._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_f0._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  local_f0._M_dataplus._M_p._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_c8,"1","shm_it.first->first",(int *)&local_f0,(int *)rhs);
  if (local_c8[0] == (SelectKey)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)local_c8._8_8_ ==
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)0x0) {
      ppVar8 = (pointer)0xafc493;
    }
    else {
      ppVar8 = *(pointer *)local_c8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x3cc,(char *)ppVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if ((long *)local_f0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_f0._M_dataplus._M_p + 8))();
    }
  }
  uVar4 = local_c8._8_8_;
  if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
       *)local_c8._8_8_ !=
      (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
       *)0x0) {
    if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)*(pointer *)local_c8._8_8_ !=
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)(local_c8._8_8_ + 0x10)) {
      operator_delete((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                       *)*(pointer *)local_c8._8_8_);
    }
    operator_delete((void *)uVar4);
  }
  local_f0._M_dataplus._M_p._0_4_ = 2;
  piVar7 = (int *)((long)rhs + 4);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_c8,"2","shm_it.first->second",(int *)&local_f0,piVar7);
  if (local_c8[0] == (SelectKey)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)local_c8._8_8_ ==
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)0x0) {
      ppVar8 = (pointer)0xafc493;
    }
    else {
      ppVar8 = *(pointer *)local_c8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x3cd,(char *)ppVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if ((long *)local_f0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_f0._M_dataplus._M_p + 8))();
    }
  }
  uVar4 = local_c8._8_8_;
  if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
       *)local_c8._8_8_ !=
      (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
       *)0x0) {
    if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)*(pointer *)local_c8._8_8_ !=
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)(local_c8._8_8_ + 0x10)) {
      operator_delete((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                       *)*(pointer *)local_c8._8_8_);
    }
    operator_delete((void *)uVar4);
  }
  *piVar7 = 0x14;
  local_f0._M_dataplus._M_p._0_4_ = 0x14;
  local_100.first = 1;
  pvVar5 = google::
           sparse_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
           ::
           find_or_insert<google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::DefaultValue>
                     ((sparse_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                       *)&local_78,&local_100.first);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_c8,"20","shm[1]",(int *)&local_f0,&pvVar5->second);
  if (local_c8[0] == (SelectKey)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)local_c8._8_8_ ==
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)0x0) {
      ppVar8 = (pointer)0xafc493;
    }
    else {
      ppVar8 = *(pointer *)local_c8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x3cf,(char *)ppVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if ((long *)local_f0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_f0._M_dataplus._M_p + 8))();
    }
  }
  uVar4 = local_c8._8_8_;
  if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
       *)local_c8._8_8_ !=
      (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
       *)0x0) {
    if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)*(pointer *)local_c8._8_8_ !=
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)(local_c8._8_8_ + 0x10)) {
      operator_delete((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                       *)*(pointer *)local_c8._8_8_);
    }
    operator_delete((void *)uVar4);
  }
  local_f0._M_dataplus._M_p = &DAT_400000002;
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::resize_delta(&local_78,1);
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_bool>
                     *)local_c8,&local_78,(const_reference)&local_f0);
  local_f0._M_dataplus._M_p._0_1_ = local_80._0_1_;
  local_f0._M_string_length = 0;
  if (local_80._0_1_ == false) {
    testing::Message::Message((Message *)&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)&local_f0,(AssertionResult *)"shm_it.second","false",
               "true",(char *)set);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x3d2,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)local_c8._0_8_ !=
        (sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)local_b8) {
      operator_delete((void *)local_c8._0_8_);
    }
    if (local_100 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_100 + 8))();
    }
  }
  sVar2 = local_f0._M_string_length;
  if ((int *)local_f0._M_string_length != (int *)0x0) {
    if (*(int **)local_f0._M_string_length != (int *)(local_f0._M_string_length + 0x10)) {
      operator_delete(*(int **)local_f0._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  local_f0._M_dataplus._M_p._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_c8,"2","shm_it.first->first",(int *)&local_f0,(int *)local_a8);
  if (local_c8[0] == (SelectKey)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)local_c8._8_8_ ==
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)0x0) {
      ppVar8 = (pointer)0xafc493;
    }
    else {
      ppVar8 = *(pointer *)local_c8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x3d3,(char *)ppVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if ((long *)local_f0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_f0._M_dataplus._M_p + 8))();
    }
  }
  uVar4 = local_c8._8_8_;
  if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
       *)local_c8._8_8_ !=
      (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
       *)0x0) {
    if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)*(pointer *)local_c8._8_8_ !=
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)(local_c8._8_8_ + 0x10)) {
      operator_delete((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                       *)*(pointer *)local_c8._8_8_);
    }
    operator_delete((void *)uVar4);
  }
  local_f0._M_dataplus._M_p._0_4_ = 4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_c8,"4","shm_it.first->second",(int *)&local_f0,
             (int *)((long)local_a8 + 4));
  if (local_c8[0] == (SelectKey)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)local_c8._8_8_ ==
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)0x0) {
      ppVar8 = (pointer)0xafc493;
    }
    else {
      ppVar8 = *(pointer *)local_c8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x3d4,(char *)ppVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if ((long *)local_f0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_f0._M_dataplus._M_p + 8))();
    }
  }
  uVar4 = local_c8._8_8_;
  if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
       *)local_c8._8_8_ !=
      (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
       *)0x0) {
    if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)*(pointer *)local_c8._8_8_ !=
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)(local_c8._8_8_ + 0x10)) {
      operator_delete((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                       *)*(pointer *)local_c8._8_8_);
    }
    operator_delete((void *)uVar4);
  }
  local_f0._M_dataplus._M_p._0_4_ = 4;
  local_100.first = 2;
  pvVar5 = google::
           sparse_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
           ::
           find_or_insert<google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::DefaultValue>
                     ((sparse_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                       *)&local_78,&local_100.first);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_c8,"4","shm[2]",(int *)&local_f0,&pvVar5->second);
  if (local_c8[0] == (SelectKey)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)local_c8._8_8_ ==
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)0x0) {
      ppVar8 = (pointer)0xafc493;
    }
    else {
      ppVar8 = *(pointer *)local_c8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x3d5,(char *)ppVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if ((long *)local_f0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_f0._M_dataplus._M_p + 8))();
    }
  }
  if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
       *)local_c8._8_8_ !=
      (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
       *)0x0) {
    if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)*(pointer *)local_c8._8_8_ !=
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)(local_c8._8_8_ + 0x10)) {
      operator_delete((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                       *)*(pointer *)local_c8._8_8_);
    }
    operator_delete((void *)local_c8._8_8_);
  }
  local_b8[8] = '\0';
  local_b8._12_4_ = 0;
  local_b8._0_8_ =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
        *)0x3e4ccccd3f000000;
  iStack_a0._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
        *)0x0;
  local_98._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
        *)0x0;
  local_90._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
        *)&DAT_00000020;
  local_80 = (pointer)0x0;
  local_c8._0_8_ =
       (sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
        *)0x10;
  local_c8._8_8_ = &DAT_00000006;
  local_b8._9_2_ = 1;
  local_a8.delkey = 0;
  local_a8.empty_key = 0;
  local_80 = (pointer)malloc(0x100);
  memset(local_80,0,0x100);
  local_f0._M_dataplus._M_p._0_4_ = 1;
  pvVar6 = google::
           dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
           ::find_or_insert<int,int>
                     ((dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                       *)local_c8,(int *)&local_f0);
  pvVar6->second = 2;
  local_100 = (pair<const_int,_int>)&DAT_300000001;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::resize_delta((dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                  *)local_c8,1);
  local_108.data_._0_4_ = local_100.first;
  google::
  dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
  ::insert_noresize<int,std::pair<int_const,int>>
            ((pair<google::dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_bool>
              *)&local_f0,
             (dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
              *)local_c8,(int *)&local_108,&local_100);
  sVar2 = local_f0._M_string_length;
  local_100 = (pair<const_int,_int>)(CONCAT71(local_100._1_7_,local_f0.field_2._M_local_buf[8]) ^ 1)
  ;
  local_f8 = (undefined8 *)0x0;
  if (local_f0.field_2._M_local_buf[8] != '\0') {
    testing::Message::Message((Message *)&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,(internal *)&local_100,(AssertionResult *)"dhm_it.second","true","false",
               (char *)set);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x3dd,local_f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((long *)CONCAT44(local_108.data_._4_4_,(int)local_108.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_108.data_._4_4_,(int)local_108.data_) + 8))();
    }
  }
  puVar1 = local_f8;
  if (local_f8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_f8 != local_f8 + 2) {
      operator_delete((undefined8 *)*local_f8);
    }
    operator_delete(puVar1);
  }
  local_100.first = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_f0,"1","dhm_it.first->first",&local_100.first,(int *)sVar2);
  if ((char)local_f0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_100);
    if ((int *)local_f0._M_string_length == (int *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_f0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x3de,pcVar9);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_100 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_100 + 8))();
    }
  }
  sVar3 = local_f0._M_string_length;
  if ((int *)local_f0._M_string_length != (int *)0x0) {
    if (*(int **)local_f0._M_string_length != (int *)(local_f0._M_string_length + 0x10)) {
      operator_delete(*(int **)local_f0._M_string_length);
    }
    operator_delete((void *)sVar3);
  }
  local_100.first = 2;
  piVar7 = (int *)(sVar2 + 4);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_f0,"2","dhm_it.first->second",&local_100.first,piVar7);
  if ((char)local_f0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_100);
    if ((int *)local_f0._M_string_length == (int *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_f0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x3df,pcVar9);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_100 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_100 + 8))();
    }
  }
  sVar2 = local_f0._M_string_length;
  if ((int *)local_f0._M_string_length != (int *)0x0) {
    if (*(int **)local_f0._M_string_length != (int *)(local_f0._M_string_length + 0x10)) {
      operator_delete(*(int **)local_f0._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  *piVar7 = 0x14;
  local_100.first = 0x14;
  local_108.data_._0_4_ = 1;
  pvVar6 = google::
           dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
           ::find_or_insert<int,int>
                     ((dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                       *)local_c8,(int *)&local_108);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_f0,"20","dhm[1]",&local_100.first,&pvVar6->second);
  if ((char)local_f0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_100);
    if ((int *)local_f0._M_string_length == (int *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_f0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x3e1,pcVar9);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_100 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_100 + 8))();
    }
  }
  sVar2 = local_f0._M_string_length;
  if ((int *)local_f0._M_string_length != (int *)0x0) {
    if (*(int **)local_f0._M_string_length != (int *)(local_f0._M_string_length + 0x10)) {
      operator_delete(*(int **)local_f0._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  local_100 = (pair<const_int,_int>)&DAT_400000002;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::resize_delta((dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                  *)local_c8,1);
  local_108.data_._0_4_ = local_100.first;
  google::
  dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
  ::insert_noresize<int,std::pair<int_const,int>>
            ((pair<google::dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_bool>
              *)&local_f0,
             (dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
              *)local_c8,(int *)&local_108,&local_100);
  sVar2 = local_f0._M_string_length;
  local_100.first._0_1_ = local_f0.field_2._M_local_buf[8];
  local_f8 = (undefined8 *)0x0;
  if (local_f0.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,(internal *)&local_100,(AssertionResult *)"dhm_it.second","false","true",
               (char *)set);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x3e4,local_f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((long *)CONCAT44(local_108.data_._4_4_,(int)local_108.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_108.data_._4_4_,(int)local_108.data_) + 8))();
    }
  }
  puVar1 = local_f8;
  if (local_f8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_f8 != local_f8 + 2) {
      operator_delete((undefined8 *)*local_f8);
    }
    operator_delete(puVar1);
  }
  local_100.first = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_f0,"2","dhm_it.first->first",&local_100.first,(int *)sVar2);
  if ((char)local_f0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_100);
    if ((int *)local_f0._M_string_length == (int *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_f0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x3e5,pcVar9);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_100 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_100 + 8))();
    }
  }
  sVar3 = local_f0._M_string_length;
  if ((int *)local_f0._M_string_length != (int *)0x0) {
    if (*(int **)local_f0._M_string_length != (int *)(local_f0._M_string_length + 0x10)) {
      operator_delete(*(int **)local_f0._M_string_length);
    }
    operator_delete((void *)sVar3);
  }
  local_100.first = 4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_f0,"4","dhm_it.first->second",&local_100.first,(int *)(sVar2 + 4));
  if ((char)local_f0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_100);
    if ((int *)local_f0._M_string_length == (int *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_f0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x3e6,pcVar9);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_100 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_100 + 8))();
    }
  }
  sVar2 = local_f0._M_string_length;
  if ((int *)local_f0._M_string_length != (int *)0x0) {
    if (*(int **)local_f0._M_string_length != (int *)(local_f0._M_string_length + 0x10)) {
      operator_delete(*(int **)local_f0._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  local_100.first = 4;
  local_108.data_._0_4_ = 2;
  pvVar6 = google::
           dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
           ::find_or_insert<int,int>
                     ((dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                       *)local_c8,(int *)&local_108);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_f0,"4","dhm[2]",&local_100.first,&pvVar6->second);
  if ((char)local_f0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_100);
    if ((int *)local_f0._M_string_length == (int *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_f0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,999,pcVar9);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_100 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_100 + 8))();
    }
  }
  sVar2 = local_f0._M_string_length;
  if ((int *)local_f0._M_string_length != (int *)0x0) {
    if (*(int **)local_f0._M_string_length != (int *)(local_f0._M_string_length + 0x10)) {
      operator_delete(*(int **)local_f0._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  if (local_80 != (pointer)0x0) {
    free(local_80);
  }
  std::
  vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>_>_>
  ::~vector(&local_78.table.groups);
  return;
}

Assistant:

TEST(HashtableTest, InsertValueToMap) {
  // For the maps in particular, ensure that inserting doesn't change
  // the value.
  sparse_hash_map<int, int> shm;
  pair<sparse_hash_map<int, int>::iterator, bool> shm_it;
  shm[1] = 2;  // test a different method of inserting
  shm_it = shm.insert(pair<int, int>(1, 3));
  EXPECT_FALSE(shm_it.second);
  EXPECT_EQ(1, shm_it.first->first);
  EXPECT_EQ(2, shm_it.first->second);
  shm_it.first->second = 20;
  EXPECT_EQ(20, shm[1]);

  shm_it = shm.insert(pair<int, int>(2, 4));
  EXPECT_TRUE(shm_it.second);
  EXPECT_EQ(2, shm_it.first->first);
  EXPECT_EQ(4, shm_it.first->second);
  EXPECT_EQ(4, shm[2]);

  // Do it all again, with dense_hash_map.
  dense_hash_map<int, int> dhm;
  dhm.set_empty_key(0);
  pair<dense_hash_map<int, int>::iterator, bool> dhm_it;
  dhm[1] = 2;  // test a different method of inserting
  dhm_it = dhm.insert(pair<const int, int>(1, 3));
  EXPECT_FALSE(dhm_it.second);
  EXPECT_EQ(1, dhm_it.first->first);
  EXPECT_EQ(2, dhm_it.first->second);
  dhm_it.first->second = 20;
  EXPECT_EQ(20, dhm[1]);

  dhm_it = dhm.insert(pair<const int, int>(2, 4));
  EXPECT_TRUE(dhm_it.second);
  EXPECT_EQ(2, dhm_it.first->first);
  EXPECT_EQ(4, dhm_it.first->second);
  EXPECT_EQ(4, dhm[2]);
}